

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O1

floatx80 addFloatx80Sigs(floatx80 a,floatx80 b,flag zSign)

{
  short sVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  floatx80 fVar10;
  floatx80 fVar11;
  
  fVar10.low = b.low;
  uVar4 = a.low;
  uVar7 = a._0_8_;
  fVar10._0_4_ = b._0_4_;
  uVar8 = a._0_4_ & 0x7fff;
  uVar9 = fVar10._0_4_ & 0x7fff;
  iVar2 = uVar8 - uVar9;
  if (iVar2 == 0 || uVar8 < uVar9) {
    if (-1 < iVar2) {
      if (uVar8 != 0x7fff) {
        uVar4 = fVar10.low + uVar4;
        if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
          uVar7 = 0;
          goto LAB_00469bfa;
        }
        uVar7 = uVar4 >> 0x20;
        fVar10.low = uVar7;
        if (uVar7 == 0) {
          fVar10.low = uVar4;
        }
        uVar8 = (uint)fVar10.low << 0x10;
        if (fVar10.low >= 0x10000) {
          uVar8 = (uint)fVar10.low;
        }
        bVar6 = (fVar10.low < 0x10000) * '\x10';
        bVar5 = bVar6 + 8;
        uVar9 = uVar8 << 8;
        if (0xffffff < uVar8) {
          bVar5 = bVar6;
          uVar9 = uVar8;
        }
        bVar5 = (bVar5 | (uVar7 == 0) << 5) +
                countLeadingZeros32_countLeadingZerosHigh[uVar9 >> 0x18];
        uVar4 = uVar4 << (bVar5 & 0x3f);
        uVar8 = 1 - (int)(char)bVar5;
        uVar7 = 0;
        goto LAB_00469c25;
      }
      lVar3 = (fVar10.low | uVar4) << 1;
      goto LAB_00469a59;
    }
    if (uVar9 != 0x7fff) {
      iVar2 = iVar2 + (uint)(((undefined1  [16])a & (undefined1  [16])0x7fff) ==
                            (undefined1  [16])0x0);
      sVar1 = (short)iVar2;
      uVar8 = uVar9;
      if (sVar1 == 0) {
        uVar7 = 0;
      }
      else if (-sVar1 < 0x40) {
        uVar7 = uVar4 << ((byte)iVar2 & 0x3f);
        uVar4 = uVar4 >> ((byte)-sVar1 & 0x3f);
      }
      else if (sVar1 == -0x40) {
        uVar7 = uVar4;
        uVar4 = 0;
      }
      else {
        uVar7 = (ulong)(uVar4 != 0);
        uVar4 = 0;
      }
      goto LAB_00469bef;
    }
    if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      uVar7 = (ulong)((uint)(byte)zSign << 0xf | 0x7fff);
      uVar4 = 0x8000000000000000;
      goto LAB_00469c3d;
    }
LAB_00469a62:
    fVar10._4_4_ = 0;
    fVar10 = propagateFloatx80NaN(a,fVar10);
  }
  else {
    if (uVar8 == 0x7fff) {
      lVar3 = uVar4 * 2;
LAB_00469a59:
      if (lVar3 == 0) goto LAB_00469c3d;
      goto LAB_00469a62;
    }
    iVar2 = iVar2 - (uint)(((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0
                          );
    if (iVar2 == 0) {
      uVar7 = 0;
    }
    else if (iVar2 < 0x40) {
      uVar7 = fVar10.low << (-(byte)iVar2 & 0x3f);
      fVar10.low = fVar10.low >> ((byte)iVar2 & 0x3f);
    }
    else if (iVar2 == 0x40) {
      uVar7 = fVar10.low;
      fVar10.low = 0;
    }
    else {
      uVar7 = (ulong)(fVar10.low != 0);
      fVar10.low = 0;
    }
LAB_00469bef:
    uVar4 = uVar4 + fVar10.low;
    if (-1 < (long)uVar4) {
LAB_00469bfa:
      uVar7 = (ulong)(uVar7 != 0) | uVar4 << 0x3f;
      uVar4 = (uVar4 >> 1) + 0x8000000000000000;
      uVar8 = uVar8 + 1;
    }
LAB_00469c25:
    fVar10 = roundAndPackFloatx80(floatx80_rounding_precision,zSign,uVar8,uVar4,uVar7);
  }
  uVar4 = fVar10.low;
  uVar7 = (ulong)fVar10._0_4_;
LAB_00469c3d:
  fVar11._0_8_ = uVar7 & 0xffffffff;
  fVar11.low = uVar4;
  return fVar11;
}

Assistant:

static floatx80 addFloatx80Sigs( floatx80 a, floatx80 b, flag zSign )
{
	int32 aExp, bExp, zExp;
	bits64 aSig, bSig, zSig0, zSig1;
	int32 expDiff;

	aSig = extractFloatx80Frac( a );
	aExp = extractFloatx80Exp( a );
	bSig = extractFloatx80Frac( b );
	bExp = extractFloatx80Exp( b );
	expDiff = aExp - bExp;
	if ( 0 < expDiff ) {
		if ( aExp == 0x7FFF ) {
			if ( (bits64) ( aSig<<1 ) ) return propagateFloatx80NaN( a, b );
			return a;
		}
		if ( bExp == 0 ) --expDiff;
		shift64ExtraRightJamming( bSig, 0, expDiff, &bSig, &zSig1 );
		zExp = aExp;
	}
	else if ( expDiff < 0 ) {
		if ( bExp == 0x7FFF ) {
			if ( (bits64) ( bSig<<1 ) ) return propagateFloatx80NaN( a, b );
			return packFloatx80( zSign, 0x7FFF, LIT64( 0x8000000000000000 ) );
		}
		if ( aExp == 0 ) ++expDiff;
		shift64ExtraRightJamming( aSig, 0, - expDiff, &aSig, &zSig1 );
		zExp = bExp;
	}
	else {
		if ( aExp == 0x7FFF ) {
			if ( (bits64) ( ( aSig | bSig )<<1 ) ) {
				return propagateFloatx80NaN( a, b );
			}
			return a;
		}
		zSig1 = 0;
		zSig0 = aSig + bSig;
		if ( aExp == 0 ) {
			normalizeFloatx80Subnormal( zSig0, &zExp, &zSig0 );
			goto roundAndPack;
		}
		zExp = aExp;
		goto shiftRight1;
	}
	zSig0 = aSig + bSig;
	if ( (sbits64) zSig0 < 0 ) goto roundAndPack;
	shiftRight1:
	shift64ExtraRightJamming( zSig0, zSig1, 1, &zSig0, &zSig1 );
	zSig0 |= LIT64( 0x8000000000000000 );
	++zExp;
	roundAndPack:
	return
		roundAndPackFloatx80(
			floatx80_rounding_precision, zSign, zExp, zSig0, zSig1 );

}